

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O0

string * __thiscall
flatbuffers::(anonymous_namespace)::LuaBfbsGenerator::GenerateMethod_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Field *field)

{
  bool bVar1;
  Type *this_00;
  allocator<char> local_56;
  allocator<char> local_55 [13];
  string local_48;
  BaseType local_24;
  Field *pFStack_20;
  BaseType base_type;
  Field *field_local;
  LuaBfbsGenerator *this_local;
  
  pFStack_20 = field;
  field_local = (Field *)this;
  this_local = (LuaBfbsGenerator *)__return_storage_ptr__;
  this_00 = reflection::Field::type(field);
  local_24 = reflection::Type::base_type(this_00);
  bVar1 = IsScalar(local_24);
  if (bVar1) {
    GenerateType_abi_cxx11_(&local_48,this,local_24);
    Namer::Type(__return_storage_ptr__,(Namer *)((long)this + 0xe8),&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    bVar1 = anon_unknown_25::IsStructOrTable(local_24);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Struct",local_55);
      std::allocator<char>::~allocator(local_55);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"UOffsetTRelative",&local_56);
      std::allocator<char>::~allocator(&local_56);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateMethod(const r::Field *field) const {
    const r::BaseType base_type = field->type()->base_type();
    if (IsScalar(base_type)) { return namer_.Type(GenerateType(base_type)); }
    if (IsStructOrTable(base_type)) { return "Struct"; }
    return "UOffsetTRelative";
  }